

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubDEdge::RemoveFaceFromArray(ON_SubDEdge *this,ON_SubDFace *f)

{
  ushort uVar1;
  ON_SubDFacePtr *pOVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  
  if (f == (ON_SubDFace *)0x0) {
    return false;
  }
  uVar1 = this->m_face_count;
  uVar5 = (ulong)uVar1;
  uVar6 = (uint)uVar1;
  if (uVar5 < 3) {
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        if ((ON_SubDFace *)(this->m_face2[uVar3].m_ptr & 0xfffffffffffffff8) == f) {
          if ((int)uVar3 + 1U < uVar6) {
            this->m_face2[uVar3].m_ptr = this->m_face2[uVar3 + 1].m_ptr;
          }
LAB_005d832c:
          this->m_face_count = uVar1 - 1;
          return true;
        }
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else {
    lVar4 = 0;
    do {
      if ((ON_SubDFace *)(this->m_face2[lVar4].m_ptr & 0xfffffffffffffff8) == f) {
        if (lVar4 == 0) {
          this->m_face2[0].m_ptr = this->m_face2[1].m_ptr;
        }
        pOVar2 = this->m_facex;
        this->m_face2[1].m_ptr = pOVar2->m_ptr;
        if (uVar6 != 3) {
          uVar5 = 4;
          if (4 < uVar1) {
            uVar5 = (ulong)uVar6;
          }
          memmove(pOVar2,pOVar2 + 1,uVar5 * 8 + 0x7ffffffe8 & 0x7fffffff8);
        }
        goto LAB_005d832c;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    pOVar2 = this->m_facex;
    lVar4 = 0;
    do {
      if ((ON_SubDFace *)(pOVar2[lVar4].m_ptr & 0xfffffffffffffff8) == f) {
        if ((int)lVar4 + 3U < uVar6) {
          do {
            pOVar2[lVar4].m_ptr = pOVar2[lVar4 + 1].m_ptr;
            lVar4 = lVar4 + 1;
          } while ((ulong)(uVar1 - 1) - 2 != lVar4);
        }
        goto LAB_005d832c;
      }
      lVar4 = lVar4 + 1;
    } while (uVar5 - 2 != lVar4);
  }
  return false;
}

Assistant:

bool ON_SubDEdge::RemoveFaceFromArray(
  const ON_SubDFace* f
  )
{
  unsigned int i;
  if (nullptr == f)
    return false;

  if (m_face_count <= 2)
  {
    for (i = 0; i < m_face_count; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_face2[i].m_ptr))
      {
        for (i++; i < m_face_count; i++)
          m_face2[i - 1] = m_face2[i];
        m_face_count--;
        return true;
      }
    }
  }
  else
  {
    for (i = 0; i < 2; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_face2[i].m_ptr))
      {
        for (i++; i < 2; i++)
          m_face2[i - 1] = m_face2[i];
        m_face2[1] = m_facex[0];
        for (i = 3; i < m_face_count; i++)
          m_facex[i - 3] = m_facex[i - 2];
        m_face_count--;
        return true;
      }
    }
    for (i = 2; i < m_face_count; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_facex[i - 2].m_ptr))
      {
        for (i++; i < m_face_count; i++)
          m_facex[i - 3] = m_facex[i - 2];
        m_face_count--;
        return true;
      }
    }
  }

  return false;
}